

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O0

void __thiscall
Potassco::TheoryAtom::TheoryAtom(TheoryAtom *this,Id_t a,Id_t term,IdSpan *args,Id_t *op,Id_t *rhs)

{
  size_t sVar1;
  uint *__src;
  Span<unsigned_int> *in_RCX;
  uint in_EDX;
  uint in_ESI;
  uint *in_RDI;
  uint *in_R8;
  uint *in_R9;
  
  *in_RDI = *in_RDI & 0x80000000 | in_ESI & 0x7fffffff;
  *in_RDI = *in_RDI & 0x7fffffff | (uint)(in_R8 != (uint *)0x0) << 0x1f;
  in_RDI[1] = in_EDX;
  sVar1 = size<unsigned_int>(in_RCX);
  in_RDI[2] = (uint)sVar1;
  if (in_RDI[2] != 0) {
    __src = begin<unsigned_int>(in_RCX);
    memcpy(in_RDI + 3,__src,(ulong)in_RDI[2] << 2);
  }
  if (in_R8 != (uint *)0x0) {
    in_RDI[(ulong)in_RDI[2] + 3] = *in_R8;
    in_RDI[(ulong)(in_RDI[2] + 1) + 3] = *in_R9;
  }
  return;
}

Assistant:

TheoryAtom::TheoryAtom(Id_t a, Id_t term, const IdSpan& args, Id_t* op, Id_t* rhs)
	: atom_(a)
	, guard_(op != 0)
	, termId_(term)
	, nTerms_(static_cast<uint32_t>(Potassco::size(args))) {
	nTerms_ == 0 || std::memcpy(term_, Potassco::begin(args), nTerms_ * sizeof(Id_t));
	if (op) {
		term_[nTerms_] = *op;
		term_[nTerms_ + 1] = *rhs;
	}
}